

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entries.cpp
# Opt level: O1

void duckdb::MapEntriesFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong uVar1;
  char cVar2;
  reference pvVar3;
  
  uVar1 = *(ulong *)(args + 0x18);
  pvVar3 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  if (pvVar3[8] == (value_type)0x1) {
    duckdb::Vector::SetVectorType((VectorType)result);
    duckdb::ConstantVector::SetNull(result,true);
    return;
  }
  duckdb::MapUtil::ReinterpretMap(result,pvVar3,uVar1);
  cVar2 = duckdb::DataChunk::AllConstant();
  if (cVar2 != '\0') {
    duckdb::Vector::SetVectorType((VectorType)result);
  }
  duckdb::Vector::Verify((ulong)result);
  return;
}

Assistant:

static void MapEntriesFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto count = args.size();

	auto &map = args.data[0];
	if (map.GetType().id() == LogicalTypeId::SQLNULL) {
		// Input is a constant NULL
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		return;
	}

	MapUtil::ReinterpretMap(result, map, count);

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	result.Verify(count);
}